

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O0

OptionStatus
setLocalOptionValue(HighsLogOptions *report_log_options,string *name,HighsLogOptions *log_options,
                   vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records,
                   string *value_passed)

{
  bool bVar1;
  int iVar2;
  reference ppOVar3;
  undefined8 uVar4;
  long lVar5;
  size_t sVar6;
  char *pcVar7;
  vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *in_RCX;
  string *in_RSI;
  HighsLogOptions *in_RDI;
  OptionRecordString *in_R8;
  string original_log_file;
  OptionRecordString *option;
  double value_int_double;
  HighsInt value_int_1;
  double value_double;
  bool converted_ok;
  int value_num_char;
  char *value_char;
  int scanned_num_char;
  HighsInt value_int;
  bool return_status;
  bool value_bool;
  HighsOptionType type;
  OptionStatus status;
  HighsInt index;
  string value_trim;
  undefined4 in_stack_fffffffffffffe08;
  HighsInt in_stack_fffffffffffffe0c;
  undefined1 value;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  HighsLogOptions *in_stack_fffffffffffffe18;
  string *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  bool *in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe38;
  OptionRecordString *option_00;
  HighsLogOptions *report_log_options_00;
  HighsLogOptions *in_stack_fffffffffffffeb0;
  string local_130 [32];
  string local_110 [32];
  value_type local_f0;
  HighsLogOptions *local_e8;
  uint local_dc;
  double local_d8;
  undefined1 local_cd;
  uint local_cc;
  char *local_c8;
  uint local_c0;
  uint local_bc;
  string local_b8 [34];
  undefined1 local_96;
  HighsOptionType local_94;
  undefined4 local_90;
  OptionStatus local_8c;
  int local_88;
  undefined1 local_71 [33];
  string local_50 [40];
  vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *local_28;
  string *local_18;
  HighsLogOptions *local_10;
  OptionStatus local_4;
  
  option_00 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::__cxx11::string::string(local_50,(string *)in_R8);
  report_log_options_00 = (HighsLogOptions *)local_71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_71 + 1)," ",(allocator *)report_log_options_00);
  trim((string *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
       (string *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  std::__cxx11::string::~string((string *)(local_71 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_71);
  local_8c = getOptionIndex((HighsLogOptions *)
                            CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                            in_stack_fffffffffffffe20,
                            (vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)
                            in_stack_fffffffffffffe18,
                            (HighsInt *)
                            CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  local_4 = local_8c;
  if (local_8c == kOk) {
    ppOVar3 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                        (local_28,(long)local_88);
    local_94 = (*ppOVar3)->type;
    if (local_94 == kBool) {
      std::__cxx11::string::string(local_b8,local_50);
      value = (undefined1)((uint)in_stack_fffffffffffffe0c >> 0x18);
      bVar1 = boolFromString(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      std::__cxx11::string::~string(local_b8);
      local_96 = bVar1;
      if (bVar1) {
        std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                  (local_28,(long)local_88);
        local_4 = setLocalOptionValue((OptionRecordBool *)
                                      CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                                      (bool)value);
      }
      else {
        uVar4 = std::__cxx11::string::c_str();
        highsLogUser(local_10,kError,
                     "setLocalOptionValue: Value \"%s\" cannot be interpreted as a bool\n",uVar4);
        local_4 = kIllegalValue;
      }
    }
    else if (local_94 == kInt) {
      lVar5 = std::__cxx11::string::find_first_not_of((char *)local_50,0x87cea3);
      if (lVar5 == -1) {
        local_c8 = (char *)std::__cxx11::string::c_str();
        __isoc99_sscanf(local_c8,"%d%n",&local_bc,&local_c0);
        sVar6 = strlen(local_c8);
        local_cc = (uint)sVar6;
        local_cd = local_c0 == local_cc;
        if ((bool)local_cd) {
          std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                    (local_28,(long)local_88);
          local_4 = setLocalOptionValue(in_stack_fffffffffffffe18,
                                        (OptionRecordInt *)
                                        CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10
                                                ),in_stack_fffffffffffffe0c);
        }
        else {
          uVar4 = std::__cxx11::string::c_str();
          highsLogDev(local_10,kError,
                      "setLocalOptionValue: Value = \"%s\" converts via sscanf as %d by scanning %d of %d characters\n"
                      ,uVar4,(ulong)local_bc,(ulong)local_c0,local_cc);
          local_4 = kIllegalValue;
        }
      }
      else {
        local_4 = kIllegalValue;
      }
    }
    else if (local_94 == kDouble) {
      local_d8 = 0.0;
      tolower((int)local_50);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                              (char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08))
      ;
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                                  (char *)CONCAT44(in_stack_fffffffffffffe0c,
                                                   in_stack_fffffffffffffe08)), bVar1)) {
        local_d8 = INFINITY;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                                (char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08
                                                ));
        if (bVar1) {
          local_d8 = -INFINITY;
        }
        else {
          lVar5 = std::__cxx11::string::find_first_not_of((char *)local_50,0x87cf1e);
          if (lVar5 != -1) {
            local_4 = kIllegalValue;
            goto LAB_00517f31;
          }
          pcVar7 = (char *)std::__cxx11::string::c_str();
          local_dc = atoi(pcVar7);
          pcVar7 = (char *)std::__cxx11::string::c_str();
          local_d8 = atof(pcVar7);
          local_e8 = (HighsLogOptions *)(double)(int)local_dc;
          if ((local_d8 == (double)local_e8) && (!NAN(local_d8) && !NAN((double)local_e8))) {
            uVar4 = std::__cxx11::string::c_str();
            highsLogDev(local_e8,(HighsLogType)local_d8,(char *)local_10,1,
                        "setLocalOptionValue: Value = \"%s\" converts via atoi as %d so is %g as double, and %g via atof\n"
                        ,uVar4,(ulong)local_dc);
          }
        }
      }
      std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                (local_28,(long)local_88);
      local_4 = setLocalOptionValue(in_stack_fffffffffffffe18,
                                    (OptionRecordDouble *)
                                    CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                                    (double)CONCAT44(in_stack_fffffffffffffe0c,
                                                     in_stack_fffffffffffffe08));
    }
    else {
      iVar2 = std::__cxx11::string::compare(local_18);
      if (iVar2 == 0) {
        ppOVar3 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                            (local_28,(long)local_88);
        local_f0 = *ppOVar3;
        std::__cxx11::string::string(local_110,(string *)local_f0[1]._vptr_OptionRecord);
        iVar2 = std::__cxx11::string::compare((string *)option_00);
        if (iVar2 != 0) {
          std::__cxx11::string::string(local_130,(string *)option_00);
          highsOpenLogFile(in_stack_fffffffffffffeb0,
                           (vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *)
                           report_log_options_00,(string *)option_00);
          std::__cxx11::string::~string(local_130);
        }
        std::__cxx11::string::~string(local_110);
      }
      iVar2 = std::__cxx11::string::compare(local_18);
      if (iVar2 == 0) {
        highsLogUser(local_10,kError,"setLocalOptionValue: model filename cannot be set\n");
        local_4 = kUnknownOption;
      }
      else {
        std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                  (local_28,(long)local_88);
        std::__cxx11::string::string((string *)&stack0xfffffffffffffeb0,(string *)option_00);
        local_4 = setLocalOptionValue(report_log_options_00,option_00,(string *)in_R8);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb0);
      }
    }
  }
LAB_00517f31:
  local_90 = 1;
  std::__cxx11::string::~string(local_50);
  return local_4;
}

Assistant:

OptionStatus setLocalOptionValue(const HighsLogOptions& report_log_options,
                                 const std::string& name,
                                 HighsLogOptions& log_options,
                                 std::vector<OptionRecord*>& option_records,
                                 const std::string value_passed) {
  // Trim any leading and trailing spaces
  std::string value_trim = value_passed;
  trim(value_trim, " ");
  HighsInt index;
  OptionStatus status =
      getOptionIndex(report_log_options, name, option_records, index);
  if (status != OptionStatus::kOk) return status;
  HighsOptionType type = option_records[index]->type;
  if (type == HighsOptionType::kBool) {
    bool value_bool;
    bool return_status = boolFromString(value_trim, value_bool);
    if (!return_status) {
      highsLogUser(
          report_log_options, HighsLogType::kError,
          "setLocalOptionValue: Value \"%s\" cannot be interpreted as a bool\n",
          value_trim.c_str());
      return OptionStatus::kIllegalValue;
    }
    return setLocalOptionValue(((OptionRecordBool*)option_records[index])[0],
                               value_bool);
  } else if (type == HighsOptionType::kInt) {
    // Check that the string only contains legitimate characters
    if (value_trim.find_first_not_of("+-0123456789eE") != std::string::npos)
      return OptionStatus::kIllegalValue;
    HighsInt value_int;
    int scanned_num_char;
    const char* value_char = value_trim.c_str();
    sscanf(value_char, "%" HIGHSINT_FORMAT "%n", &value_int, &scanned_num_char);
    const int value_num_char = strlen(value_char);
    // Check that all characters in value_char are scanned by the format
    const bool converted_ok = scanned_num_char == value_num_char;
    if (!converted_ok) {
      highsLogDev(report_log_options, HighsLogType::kError,
                  "setLocalOptionValue: Value = \"%s\" converts via sscanf as "
                  "%" HIGHSINT_FORMAT
                  " "
                  "by scanning %" HIGHSINT_FORMAT " of %" HIGHSINT_FORMAT
                  " characters\n",
                  value_trim.c_str(), value_int, scanned_num_char,
                  value_num_char);
      return OptionStatus::kIllegalValue;
    }
    return setLocalOptionValue(report_log_options,
                               ((OptionRecordInt*)option_records[index])[0],
                               value_int);
  } else if (type == HighsOptionType::kDouble) {
    // Check that the string only contains legitimate characters -
    // after handling +/- inf
    double value_double = 0;
    tolower(value_trim);
    if (value_trim == "inf" || value_trim == "+inf") {
      value_double = kHighsInf;
    } else if (value_trim == "-inf") {
      value_double = -kHighsInf;
    } else {
      if (value_trim.find_first_not_of("+-.0123456789eE") != std::string::npos)
        return OptionStatus::kIllegalValue;
      HighsInt value_int = atoi(value_trim.c_str());
      value_double = atof(value_trim.c_str());
      double value_int_double = value_int;
      if (value_double == value_int_double) {
        highsLogDev(report_log_options, HighsLogType::kInfo,
                    "setLocalOptionValue: Value = \"%s\" converts via atoi as "
                    "%" HIGHSINT_FORMAT
                    " "
                    "so is %g as double, and %g via atof\n",
                    value_trim.c_str(), value_int, value_int_double,
                    value_double);
      }
    }
    return setLocalOptionValue(report_log_options,
                               ((OptionRecordDouble*)option_records[index])[0],
                               value_double);
  } else {
    // Setting a string option value
    if (!name.compare(kLogFileString)) {
      OptionRecordString& option = *(OptionRecordString*)option_records[index];
      std::string original_log_file = *(option.value);
      if (value_passed.compare(original_log_file)) {
        // Changing the name of the log file
        highsOpenLogFile(log_options, option_records, value_passed);
      }
    }
    if (!name.compare(kModelFileString)) {
      // Don't allow model filename to be changed - it's only an
      // option so that reading of run-time options works
      highsLogUser(report_log_options, HighsLogType::kError,
                   "setLocalOptionValue: model filename cannot be set\n");
      return OptionStatus::kUnknownOption;
    } else {
      return setLocalOptionValue(
          report_log_options, ((OptionRecordString*)option_records[index])[0],
          value_passed);
    }
  }
}